

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * offsetFromAbbreviation(QString *text)

{
  bool bVar1;
  qsizetype qVar2;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QStringView QVar3;
  QStringView tail;
  QStringBuilder<QStringView_&,_QLatin1String> *in_stack_ffffffffffffff68;
  QStringView *str;
  QLatin1StringView in_stack_ffffffffffffff80;
  QStringView *this;
  undefined1 *local_28;
  storage_type_conflict *local_20;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_18.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  str = in_RDI;
  QStringView::QStringView<QString,_true>
            ((QStringView *)in_stack_ffffffffffffff80.m_size,(QString *)in_RDI);
  s = Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
  bVar1 = QStringView::startsWith((QStringView *)in_stack_ffffffffffffff68,s,CaseInsensitive);
  this = (QStringView *)s.m_size;
  if (!bVar1) {
    in_stack_ffffffffffffff80 =
         Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
    this = (QStringView *)s.m_size;
    bVar1 = QStringView::startsWith((QStringView *)in_stack_ffffffffffffff68,s,CaseInsensitive);
    if (!bVar1) goto LAB_004d41dd;
  }
  QVar3 = QStringView::sliced(this,(qsizetype)in_stack_ffffffffffffff80.m_data);
  local_28 = (undefined1 *)QVar3.m_size;
  local_18.m_size = (qsizetype)local_28;
  local_20 = QVar3.m_data;
  local_18.m_data = local_20;
LAB_004d41dd:
  bVar1 = QStringView::isEmpty((QStringView *)0x4d41ea);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_ffffffffffffff80.m_data,in_stack_ffffffffffffff80.m_size);
  }
  else {
    qVar2 = QStringView::size(&local_18);
    if (qVar2 < 4) {
      Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
      operator+(in_RDI,(QLatin1String *)in_stack_ffffffffffffff68);
      QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff68);
    }
    else {
      QStringView::size(&local_18);
      QString::right((QString *)in_stack_ffffffffffffff80.m_data,in_stack_ffffffffffffff80.m_size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)str;
}

Assistant:

static QString offsetFromAbbreviation(QString &&text)
{
    QStringView tail{text};
    // May need to strip a prefix:
    if (tail.startsWith("UTC"_L1) || tail.startsWith("GMT"_L1))
        tail = tail.sliced(3);
    // TODO: there may be a locale-specific alternative prefix.
    // Hard to know without zone-name L10n details, though.
    return (tail.isEmpty() // The Qt::UTC case omits the zero offset:
            ? u"+00:00"_s
            // Whole-hour offsets may lack the zero minutes:
            : (tail.size() <= 3
               ? tail + ":00"_L1
               : std::move(text).right(tail.size())));
}